

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_load_extension(sqlite3 *db,char *zFile,char *zProc,char **pzErrMsg)

{
  ulong uVar1;
  byte bVar2;
  sqlite3_vfs *psVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  char *pcVar10;
  void *pvVar11;
  _func_void *p_Var12;
  ulong uVar13;
  byte *pbVar14;
  size_t sVar15;
  char *zBuf;
  void **__dest;
  uint uVar16;
  sqlite3_uint64 n;
  char *local_58;
  void *local_38;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  psVar3 = db->pVfs;
  local_38 = (void *)0x0;
  sVar9 = strlen(zFile);
  if (pzErrMsg == (char **)0x0) {
    if ((db->flags & 0x10000) != 0) goto LAB_001284e9;
  }
  else {
    *pzErrMsg = (char *)0x0;
    if ((db->flags & 0x10000) != 0) {
LAB_001284e9:
      local_58 = "sqlite3_extension_init";
      if (zProc != (char *)0x0) {
        local_58 = zProc;
      }
      if (sVar9 - 0x1001 < 0xfffffffffffff000) {
LAB_00128510:
        if (pzErrMsg != (char **)0x0) {
          pcVar10 = (char *)sqlite3_malloc64(sVar9 + 300);
          *pzErrMsg = pcVar10;
          if (pcVar10 != (char *)0x0) {
            sqlite3_snprintf((int)(sVar9 + 300),pcVar10,"unable to open shared library [%.*s]",
                             0x1000,zFile);
            (*psVar3->xDlError)(psVar3,(int)sVar9 + 299,pcVar10);
          }
          iVar8 = 1;
          goto LAB_00128775;
        }
      }
      else {
        pvVar11 = (*psVar3->xDlOpen)(psVar3,zFile);
        bVar5 = true;
        while ((bVar5 && (pvVar11 == (void *)0x0))) {
          pcVar10 = sqlite3_mprintf("%s.%s",zFile,"so");
          if (pcVar10 == (char *)0x0) goto LAB_0012865a;
          if (sVar9 < 0xffe) {
            pvVar11 = (*psVar3->xDlOpen)(psVar3,pcVar10);
          }
          else {
            pvVar11 = (void *)0x0;
          }
          sqlite3_free(pcVar10);
          bVar5 = false;
        }
        if (pvVar11 == (void *)0x0) goto LAB_00128510;
        p_Var12 = (*psVar3->xDlSym)(psVar3,pvVar11,local_58);
        if (zProc == (char *)0x0 && p_Var12 == (_func_void *)0x0) {
          uVar6 = sqlite3Strlen30(zFile);
          pcVar10 = (char *)sqlite3_malloc64((ulong)(uVar6 + 0x1e));
          if (pcVar10 == (char *)0x0) {
            (*psVar3->xDlClose)(psVar3,pvVar11);
LAB_0012865a:
            iVar8 = 7;
            goto LAB_00128775;
          }
          builtin_strncpy(pcVar10,"sqlite3_",8);
          uVar13 = (ulong)uVar6;
          do {
            if ((long)uVar13 < 1) {
              uVar6 = 0;
              goto LAB_0012867b;
            }
            uVar1 = uVar13 - 1;
            lVar4 = uVar13 - 1;
            uVar13 = uVar1;
          } while (zFile[lVar4] != '/');
          uVar6 = (int)uVar1 + 1;
LAB_0012867b:
          iVar8 = sqlite3_strnicmp(zFile + uVar6,"lib",3);
          uVar16 = uVar6 + 3;
          if (iVar8 != 0) {
            uVar16 = uVar6;
          }
          pbVar14 = (byte *)(zFile + (int)uVar16);
          iVar8 = 8;
          while( true ) {
            bVar2 = *pbVar14;
            if ((bVar2 == 0) || (bVar2 == 0x2e)) break;
            if ((""[bVar2] & 2) != 0) {
              pcVar10[iVar8] = ""[(uint)(int)(char)bVar2];
              iVar8 = iVar8 + 1;
            }
            pbVar14 = pbVar14 + 1;
          }
          (pcVar10 + (long)iVar8 + 4)[0] = 't';
          (pcVar10 + (long)iVar8 + 4)[1] = '\0';
          builtin_strncpy(pcVar10 + iVar8,"_ini",4);
          p_Var12 = (*psVar3->xDlSym)(psVar3,pvVar11,pcVar10);
          local_58 = pcVar10;
        }
        else {
          pcVar10 = (char *)0x0;
        }
        if (p_Var12 == (_func_void *)0x0) {
          if (pzErrMsg != (char **)0x0) {
            sVar15 = strlen(local_58);
            n = sVar15 + sVar9 + 300;
            zBuf = (char *)sqlite3_malloc64(n);
            *pzErrMsg = zBuf;
            if (zBuf != (char *)0x0) {
              iVar8 = (int)n;
              sqlite3_snprintf(iVar8,zBuf,"no entry point [%s] in shared library [%s]",local_58,
                               zFile);
              (*psVar3->xDlError)(psVar3,iVar8 + -1,zBuf);
            }
          }
          (*psVar3->xDlClose)(psVar3,pvVar11);
          sqlite3_free(pcVar10);
          iVar8 = 1;
          goto LAB_00128775;
        }
        sqlite3_free(pcVar10);
        iVar7 = (*p_Var12)(db,&local_38,&sqlite3Apis);
        if (iVar7 == 0) {
          __dest = (void **)sqlite3DbMallocZero(db,(long)db->nExtension * 8 + 8);
          iVar8 = 7;
          if (__dest != (void **)0x0) {
            if (0 < (long)db->nExtension) {
              memcpy(__dest,db->aExtension,(long)db->nExtension << 3);
            }
            sqlite3DbFree(db,db->aExtension);
            db->aExtension = __dest;
            iVar8 = db->nExtension;
            db->nExtension = iVar8 + 1;
            __dest[iVar8] = pvVar11;
            iVar8 = 0;
          }
          goto LAB_00128775;
        }
        iVar8 = 0;
        if (iVar7 == 0x100) goto LAB_00128775;
        if (pzErrMsg != (char **)0x0) {
          pcVar10 = sqlite3_mprintf("error during initialization: %s",local_38);
          *pzErrMsg = pcVar10;
        }
        sqlite3_free(local_38);
        (*psVar3->xDlClose)(psVar3,pvVar11);
      }
      iVar8 = 1;
      goto LAB_00128775;
    }
    pcVar10 = sqlite3_mprintf("not authorized");
    *pzErrMsg = pcVar10;
  }
  iVar8 = 1;
LAB_00128775:
  iVar8 = sqlite3ApiExit(db,iVar8);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar8;
}

Assistant:

SQLITE_API int sqlite3_load_extension(
  sqlite3 *db,          /* Load the extension into this database connection */
  const char *zFile,    /* Name of the shared library containing extension */
  const char *zProc,    /* Entry point.  Use "sqlite3_extension_init" if 0 */
  char **pzErrMsg       /* Put error message here if not 0 */
){
  int rc;
  sqlite3_mutex_enter(db->mutex);
  rc = sqlite3LoadExtension(db, zFile, zProc, pzErrMsg);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}